

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.cpp
# Opt level: O3

void __thiscall
SQCompilation::ForStatement::transformChildren(ForStatement *this,Transformer *transformer)

{
  Node *pNVar1;
  
  if (this->_init != (Node *)0x0) {
    pNVar1 = Node::transform<SQCompilation::Transformer>(this->_init,transformer);
    this->_init = pNVar1;
  }
  if (&this->_cond->super_Node != (Node *)0x0) {
    pNVar1 = Node::transform<SQCompilation::Transformer>(&this->_cond->super_Node,transformer);
    this->_cond = (Expr *)pNVar1;
  }
  if (&this->_mod->super_Node != (Node *)0x0) {
    pNVar1 = Node::transform<SQCompilation::Transformer>(&this->_mod->super_Node,transformer);
    this->_mod = (Expr *)pNVar1;
  }
  pNVar1 = Node::transform<SQCompilation::Transformer>
                     (&((this->super_LoopStatement)._body)->super_Node,transformer);
  (this->super_LoopStatement)._body = (Statement *)pNVar1;
  return;
}

Assistant:

void ForStatement::transformChildren(Transformer *transformer) {
  if (_init) _init = _init->transform(transformer);
  if (_cond) _cond = _cond->transform(transformer)->asExpression();
  if (_mod) _mod = _mod->transform(transformer)->asExpression();

  LoopStatement::transformChildren(transformer);
}